

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_TestMemoryAccountant_reportAllocations_Test::testBody
          (TEST_TestMemoryAccountant_reportAllocations_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_20 [24];
  TEST_TestMemoryAccountant_reportAllocations_Test *this_local;
  
  local_20._16_8_ = this;
  MemoryAccountant::dealloc
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,8);
  MemoryAccountant::dealloc
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,8);
  MemoryAccountant::dealloc
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,8);
  MemoryAccountant::alloc(&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,4);
  MemoryAccountant::dealloc
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,4);
  MemoryAccountant::alloc(&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,4);
  pUVar1 = UtestShell::getCurrent();
  MemoryAccountant::report((MemoryAccountant *)local_20);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_20);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "CppUTest Memory Accountant report:\nAllocation size     # allocations    # deallocations   max # allocations at one time\n    4                   2                1                 1\n    8                   0                3                 0\n   Thank you for your business\n"
             ,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x1c0,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_20);
  return;
}

Assistant:

TEST(TestMemoryAccountant, reportAllocations)
{
    accountant.dealloc(8);
    accountant.dealloc(8);
    accountant.dealloc(8);

    accountant.alloc(4);
    accountant.dealloc(4);
    accountant.alloc(4);
    STRCMP_EQUAL("CppUTest Memory Accountant report:\n"
                 "Allocation size     # allocations    # deallocations   max # allocations at one time\n"
                 "    4                   2                1                 1\n"
                 "    8                   0                3                 0\n"
                 "   Thank you for your business\n"
                 , accountant.report().asCharString());
}